

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_threading.hpp
# Opt level: O2

unordered_map<const_void_*,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>_>_>
* chaiscript::detail::threading::
  Thread_Storage<std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>
  ::t(void)

{
  char *pcVar1;
  unordered_map<const_void_*,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>_>_>
  *puVar2;
  long *plVar3;
  undefined1 *puVar4;
  
  pcVar1 = (char *)__tls_get_addr(&PTR_003cb930);
  if (*pcVar1 == '\0') {
    plVar3 = (long *)__tls_get_addr(&PTR_003cb2c8);
    *plVar3 = (long)(plVar3 + 6);
    plVar3[1] = 1;
    plVar3[2] = 0;
    plVar3[3] = 0;
    *(undefined4 *)(plVar3 + 4) = 0x3f800000;
    plVar3[5] = 0;
    plVar3[6] = 0;
    __cxa_thread_atexit(std::
                        unordered_map<const_void_*,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>_>_>
                        ::~unordered_map,plVar3,&__dso_handle);
    puVar4 = (undefined1 *)__tls_get_addr(&PTR_003cb930);
    *puVar4 = 1;
  }
  puVar2 = (unordered_map<const_void_*,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>_>_>
            *)__tls_get_addr(&PTR_003cb2c8);
  return puVar2;
}

Assistant:

static std::unordered_map<const void *, T> &t() noexcept {
      static thread_local std::unordered_map<const void *, T> my_t;
      return my_t;
    }